

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::MergeReturnPass::ProcessStructured
          (MergeReturnPass *this,Function *function,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *return_blocks)

{
  pointer *ppSVar1;
  IRContext *pIVar2;
  StructuredControlState *pSVar3;
  BasicBlock *block_00;
  Instruction *pIVar4;
  _Rb_tree_node_base *p_Var5;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *pvVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  _Var10;
  const_iterator __first;
  key_type *extraout_RDX;
  key_type *extraout_RDX_00;
  key_type *extraout_RDX_01;
  key_type *extraout_RDX_02;
  key_type *extraout_RDX_03;
  key_type *extraout_RDX_04;
  key_type *extraout_RDX_05;
  key_type *__k;
  key_type *extraout_RDX_06;
  const_iterator __last;
  iterator iVar11;
  _Rb_tree_node_base *p_Var12;
  map<const_spvtools::opt::Function_*,_spvtools::opt::DominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
  *__return_storage_ptr__;
  BasicBlock *block;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  predicated;
  undefined1 local_a0 [8];
  _Rb_tree_node_base local_98;
  vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
  *local_78;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *local_70;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  bVar7 = HasNontrivialUnreachableBlocks(this,function);
  if (bVar7) {
    if ((this->super_MemPass).super_Pass.consumer_.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      local_68._M_buckets = &local_68._M_before_begin._M_nxt;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Module contains unreachable blocks during merge return.  Run dead branch elimination before merge return."
                 ,"");
      local_98._M_color = _S_red;
      local_98._4_4_ = 0;
      local_98._M_parent = (_Base_ptr)0x0;
      local_98._M_left = (_Base_ptr)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_MemPass).super_Pass.consumer_,SPV_MSG_ERROR,(char *)0x0,
                   (spv_position_t *)&local_98,(char *)local_68._M_buckets);
      if ((__node_base *)local_68._M_buckets != &local_68._M_before_begin) {
        operator_delete(local_68._M_buckets,
                        (ulong)((long)&(local_68._M_before_begin._M_nxt)->_M_nxt + 1));
      }
    }
  }
  else {
    RecordImmediateDominators(this,function);
    bVar7 = AddSingleCaseSwitchAroundFunction(this);
    if (bVar7) {
      local_98._0_8_ = &local_98;
      local_98._M_left = (_Base_ptr)0x0;
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      local_98._M_parent = (_Base_ptr)local_98._0_8_;
      if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar2);
      }
      CFG::ComputeStructuredOrder
                ((pIVar2->cfg_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                 .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,function,
                 (BasicBlock *)
                 (((function->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t,(list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)&local_98);
      pSVar3 = (this->state_).
               super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11._M_current =
           (this->state_).
           super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current != pSVar3) {
        (this->state_).
        super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
        iVar11._M_current = pSVar3;
      }
      local_78 = (vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                  *)&this->state_;
      local_68._M_buckets = (__buckets_ptr)0x0;
      local_a0 = (undefined1  [8])0x0;
      local_98._M_right = (_Base_ptr)function;
      if (iVar11._M_current ==
          (this->state_).
          super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_70 = return_blocks;
        std::
        vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
        ::_M_realloc_insert<decltype(nullptr),decltype(nullptr)>
                  (local_78,iVar11,&local_68._M_buckets,(void **)local_a0);
        __k = extraout_RDX_00;
        p_Var12 = (_Rb_tree_node_base *)local_98._0_8_;
        pvVar6 = local_70;
      }
      else {
        (iVar11._M_current)->break_merge_ = (Instruction *)0x0;
        (iVar11._M_current)->current_merge_ = (Instruction *)0x0;
        ppSVar1 = &(this->state_).
                   super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
        __k = extraout_RDX;
        p_Var12 = (_Rb_tree_node_base *)local_98._0_8_;
        pvVar6 = return_blocks;
      }
      for (; local_70 = pvVar6, p_Var12 != &local_98; p_Var12 = *(_Rb_tree_node_base **)p_Var12) {
        block_00 = (BasicBlock *)p_Var12->_M_left;
        pIVar2 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
          __k = extraout_RDX_01;
        }
        if (&((pIVar2->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_entry_block_
            != block_00) {
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
            IRContext::BuildCFG(pIVar2);
            __k = extraout_RDX_02;
          }
          if ((&((pIVar2->cfg_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                 .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                pseudo_exit_block_ != block_00) && (block_00 != this->final_return_block_)) {
            pIVar4 = (block_00->label_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar9 = 0;
            uVar8 = 0;
            if (pIVar4->has_result_id_ == true) {
              uVar8 = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
            }
            pIVar4 = (this->state_).
                     super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].current_merge_;
            if (pIVar4 != (Instruction *)0x0) {
              uVar9 = (pIVar4->has_result_id_ & 1) + 1;
              if (pIVar4->has_type_id_ == false) {
                uVar9 = (uint)pIVar4->has_result_id_;
              }
              uVar9 = Instruction::GetSingleWordOperand(pIVar4,uVar9);
            }
            if (uVar8 == uVar9) {
              ppSVar1 = &(this->state_).
                         super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + -1;
            }
            ProcessStructuredBlock(this,block_00);
            GenerateState(this,block_00);
            __k = extraout_RDX_03;
          }
        }
        pvVar6 = local_70;
      }
      pSVar3 = (this->state_).
               super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11._M_current =
           (this->state_).
           super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current != pSVar3) {
        (this->state_).
        super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
        iVar11._M_current = pSVar3;
      }
      local_68._M_buckets = (__buckets_ptr)0x0;
      local_a0 = (undefined1  [8])0x0;
      if (iVar11._M_current ==
          (this->state_).
          super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
        ::_M_realloc_insert<decltype(nullptr),decltype(nullptr)>
                  (local_78,iVar11,&local_68._M_buckets,(void **)local_a0);
        __k = extraout_RDX_04;
      }
      else {
        (iVar11._M_current)->break_merge_ = (Instruction *)0x0;
        (iVar11._M_current)->current_merge_ = (Instruction *)0x0;
        ppSVar1 = &(this->state_).
                   super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      p_Var12 = (_Rb_tree_node_base *)local_98._0_8_;
      do {
        if (p_Var12 == &local_98) {
          __return_storage_ptr__ = &((this->super_MemPass).super_Pass.context_)->dominator_trees_;
          local_a0 = (undefined1  [8])local_98._M_right;
          __first._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
               ::equal_range((pair<std::_Rb_tree_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::_Rb_tree_iterator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
                              *)__return_storage_ptr__,
                             (_Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
                              *)local_a0,__k);
          std::
          _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
          ::_M_erase_aux(&__return_storage_ptr__->_M_t,__first,__last);
          AddNewPhiNodes(this);
          bVar7 = true;
LAB_005f3864:
          std::
          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
          p_Var12 = (_Rb_tree_node_base *)local_98._0_8_;
          while (p_Var12 != &local_98) {
            p_Var5 = *(_Rb_tree_node_base **)p_Var12;
            operator_delete(p_Var12,0x18);
            p_Var12 = p_Var5;
          }
          return bVar7;
        }
        local_a0 = (undefined1  [8])p_Var12->_M_left;
        pIVar2 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
          __k = extraout_RDX_05;
        }
        if ((undefined1  [8])
            &((pIVar2->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_entry_block_
            != local_a0) {
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
            IRContext::BuildCFG(pIVar2);
          }
          __k = (key_type *)0xc8;
          if ((undefined1  [8])
              &((pIVar2->cfg_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
                _M_t.
                super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
               pseudo_exit_block_ != local_a0) {
            pIVar4 = (Instruction *)
                     (((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        *)((long)local_a0 + 8))->
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar9 = 0;
            uVar8 = 0;
            if (pIVar4->has_result_id_ == true) {
              uVar8 = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
            }
            pIVar4 = (this->state_).
                     super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].current_merge_;
            if (pIVar4 != (Instruction *)0x0) {
              uVar9 = (pIVar4->has_result_id_ & 1) + 1;
              if (pIVar4->has_type_id_ == false) {
                uVar9 = (uint)pIVar4->has_result_id_;
              }
              uVar9 = Instruction::GetSingleWordOperand(pIVar4,uVar9);
            }
            if (uVar8 == uVar9) {
              ppSVar1 = &(this->state_).
                         super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + -1;
            }
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock*const*,std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::BasicBlock*const>>
                               ((pvVar6->
                                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pvVar6->
                                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish,local_a0);
            if ((_Var10._M_current !=
                 (pvVar6->
                 super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish) &&
               (bVar7 = PredicateBlocks(this,(BasicBlock *)local_a0,
                                        (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                         *)&local_68,
                                        (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                         *)&local_98), !bVar7)) {
              bVar7 = false;
              goto LAB_005f3864;
            }
            GenerateState(this,(BasicBlock *)local_a0);
            __k = extraout_RDX_06;
          }
        }
        p_Var12 = *(_Rb_tree_node_base **)p_Var12;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool MergeReturnPass::ProcessStructured(
    Function* function, const std::vector<BasicBlock*>& return_blocks) {
  if (HasNontrivialUnreachableBlocks(function)) {
    if (consumer()) {
      std::string message =
          "Module contains unreachable blocks during merge return.  Run dead "
          "branch elimination before merge return.";
      consumer()(SPV_MSG_ERROR, 0, {0, 0, 0}, message.c_str());
    }
    return false;
  }

  RecordImmediateDominators(function);
  if (!AddSingleCaseSwitchAroundFunction()) {
    return false;
  }

  std::list<BasicBlock*> order;
  cfg()->ComputeStructuredOrder(function, &*function->begin(), &order);

  state_.clear();
  state_.emplace_back(nullptr, nullptr);
  for (auto block : order) {
    if (cfg()->IsPseudoEntryBlock(block) || cfg()->IsPseudoExitBlock(block) ||
        block == final_return_block_) {
      continue;
    }

    auto blockId = block->GetLabelInst()->result_id();
    if (blockId == CurrentState().CurrentMergeId()) {
      // Pop the current state as we've hit the merge
      state_.pop_back();
    }

    ProcessStructuredBlock(block);

    // Generate state for next block if warranted
    GenerateState(block);
  }

  state_.clear();
  state_.emplace_back(nullptr, nullptr);
  std::unordered_set<BasicBlock*> predicated;
  for (auto block : order) {
    if (cfg()->IsPseudoEntryBlock(block) || cfg()->IsPseudoExitBlock(block)) {
      continue;
    }

    auto blockId = block->id();
    if (blockId == CurrentState().CurrentMergeId()) {
      // Pop the current state as we've hit the merge
      state_.pop_back();
    }

    // Predicate successors of the original return blocks as necessary.
    if (std::find(return_blocks.begin(), return_blocks.end(), block) !=
        return_blocks.end()) {
      if (!PredicateBlocks(block, &predicated, &order)) {
        return false;
      }
    }

    // Generate state for next block if warranted
    GenerateState(block);
  }

  // We have not kept the dominator tree up-to-date.
  // Invalidate it at this point to make sure it will be rebuilt.
  context()->RemoveDominatorAnalysis(function);
  AddNewPhiNodes();
  return true;
}